

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.hh
# Opt level: O1

bool __thiscall QPDFTokenizer::Token::operator==(Token *this,Token *rhs)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  
  bVar2 = false;
  if ((*(int *)this != 0) && (*(int *)this == *(int *)rhs)) {
    __n = *(size_t *)(this + 0x10);
    if (__n != *(size_t *)(rhs + 0x10)) {
      return false;
    }
    if (__n == 0) {
      return true;
    }
    iVar1 = bcmp(*(void **)(this + 8),*(void **)(rhs + 8),__n);
    bVar2 = iVar1 == 0;
  }
  return bVar2;
}

Assistant:

bool
        operator==(Token const& rhs) const
        {
            // Ignore fields other than type and value
            return (
                (this->type != tt_bad) && (this->type == rhs.type) && (this->value == rhs.value));
        }